

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tun_linux.c
# Opt level: O0

_Bool if_settun(int fd,char *ifname,int *if_index)

{
  int iVar1;
  undefined4 *in_RDX;
  char *in_RSI;
  int in_EDI;
  ifreq r;
  char local_40 [16];
  undefined4 local_30;
  undefined4 *local_18;
  char *local_10;
  int local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memset(local_40,0,0x28);
  local_30 = CONCAT22(local_30._2_2_,1);
  strncpy(local_40,local_10,0x10);
  iVar1 = ioctl(local_8,0x400454ca,local_40);
  if (iVar1 != -1) {
    *local_18 = local_30;
  }
  return iVar1 != -1;
}

Assistant:

static bool if_settun(int fd, const char * ifname, int * if_index)
{
  struct ifreq r;
  memset(&r, 0, sizeof(struct ifreq));
  r.ifr_flags = IFF_TUN;
  strncpy(r.ifr_name, ifname, sizeof(r.ifr_name));
  if(ioctl(fd, TUNSETIFF, &r) == -1) return false;
  *if_index = r.ifr_ifindex;
  return true;
}